

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O0

int zddGroupSiftingDown(DdManager *table,int x,int xHigh,Move **moves)

{
  Move *pMVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdHalfWord local_40;
  uint local_3c;
  int gybot;
  int limitSize;
  int size;
  int y;
  Move *move;
  Move **moves_local;
  int xHigh_local;
  int x_local;
  DdManager *table_local;
  
  local_3c = table->keysZ;
  limitSize = cuddZddNextHigh(table,x);
  moves_local._4_4_ = x;
  do {
    if (xHigh < limitSize) {
      return 1;
    }
    local_40 = table->subtableZ[limitSize].next;
    while (table->subtableZ[(int)local_40].next != limitSize) {
      local_40 = table->subtableZ[(int)local_40].next;
    }
    if ((table->subtableZ[(int)moves_local._4_4_].next == moves_local._4_4_) &&
       (table->subtableZ[limitSize].next == limitSize)) {
      uVar2 = cuddZddSwapInPlace(table,moves_local._4_4_,limitSize);
      if ((uVar2 == 0) || (pDVar3 = cuddDynamicAllocNode(table), pDVar3 == (DdNode *)0x0)) {
LAB_00c0e5cd:
        while (*moves != (Move *)0x0) {
          pMVar1 = (*moves)->next;
          (*moves)->y = 0;
          *(DdNode **)&(*moves)->flags = table->nextFree;
          table->nextFree = (DdNode *)*moves;
          *moves = pMVar1;
        }
        return 0;
      }
      pDVar3->index = moves_local._4_4_;
      pDVar3->ref = limitSize;
      *(undefined4 *)&pDVar3->next = 0;
      *(uint *)((long)&pDVar3->next + 4) = uVar2;
      (pDVar3->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar3;
      if ((double)(int)local_3c * table->maxGrowth < (double)(int)uVar2) {
        return 1;
      }
      if ((int)uVar2 < (int)local_3c) {
        local_3c = uVar2;
      }
      cuddZddNextHigh(table,limitSize);
    }
    else {
      uVar2 = zddGroupMove(table,moves_local._4_4_,limitSize,moves);
      if (uVar2 == 0) goto LAB_00c0e5cd;
      if ((double)(int)local_3c * table->maxGrowth < (double)(int)uVar2) {
        return 1;
      }
      if ((int)uVar2 < (int)local_3c) {
        local_3c = uVar2;
      }
    }
    moves_local._4_4_ = local_40;
    limitSize = cuddZddNextHigh(table,local_40);
  } while( true );
}

Assistant:

static int
zddGroupSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh,
  Move ** moves)
{
    Move *move;
    int  y;
    int  size;
    int  limitSize;
    int  gybot;


    /* Initialize R */
    limitSize = size = table->keysZ;
    y = cuddZddNextHigh(table,x);
    while (y <= xHigh) {
        /* Find bottom of y group. */
        gybot = table->subtableZ[y].next;
        while (table->subtableZ[gybot].next != (unsigned) y)
            gybot = table->subtableZ[gybot].next;

        if (table->subtableZ[x].next == (unsigned) x &&
            table->subtableZ[y].next == (unsigned) y) {
            /* x and y are self groups */
            size = cuddZddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtableZ[x].next == (unsigned) x);
            assert(table->subtableZ[y].next == (unsigned) y);
#endif
            if (size == 0) goto zddGroupSiftingDownOutOfMem;

            /* Record move. */
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto zddGroupSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingDown (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
            x = y;
            y = cuddZddNextHigh(table,x);
        } else { /* Group move */
            size = zddGroupMove(table,x,y,moves);
            if (size == 0) goto zddGroupSiftingDownOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        }
        x = gybot;
        y = cuddZddNextHigh(table,x);
    }

    return(1);

zddGroupSiftingDownOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }

    return(0);

}